

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void luaX_init(lua_State *L)

{
  uint __line;
  TString *pTVar1;
  lu_byte lVar2;
  char *__assertion;
  long lVar3;
  
  pTVar1 = luaS_newlstr(L,"_ENV",4);
  if ((pTVar1->tt & 0xe) < 10) {
    luaC_fix(L,(GCObject *)pTVar1);
    lVar2 = '\x01';
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 0xb8) {
        return;
      }
      pTVar1 = luaS_new(L,*(char **)((long)luaX_tokens + lVar3));
      if (9 < (pTVar1->tt & 0xe)) break;
      luaC_fix(L,(GCObject *)pTVar1);
      pTVar1->extra = lVar2;
      lVar3 = lVar3 + 8;
      lVar2 = lVar2 + '\x01';
    }
    __assertion = "(((ts)->tt) & 0x0F) < (9+1)";
    __line = 0x52;
  }
  else {
    __assertion = "(((e)->tt) & 0x0F) < (9+1)";
    __line = 0x4f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                ,__line,"void luaX_init(lua_State *)");
}

Assistant:

void luaX_init (lua_State *L) {
  int i;
  TString *e = luaS_newliteral(L, LUA_ENV);  /* create env name */
  luaC_fix(L, obj2gco(e));  /* never collect this name */
  for (i=0; i<NUM_RESERVED; i++) {
    TString *ts = luaS_new(L, luaX_tokens[i]);
    luaC_fix(L, obj2gco(ts));  /* reserved words are never collected */
    ts->extra = cast_byte(i+1);  /* reserved word */
  }
}